

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

bool __thiscall ON_Buffer::IsValid(ON_Buffer *this,ON_TextLog *text_log)

{
  ulong uVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  ON_BUFFER_SEGMENT *pOVar3;
  ulong uVar4;
  ON_BUFFER_SEGMENT *pOVar5;
  ulong uVar6;
  ON_BUFFER_SEGMENT *pOVar7;
  ON__UINT64 OVar8;
  
  uVar1 = this->m_buffer_size;
  pOVar2 = this->m_first_segment;
  if (uVar1 == 0) {
    if (pOVar2 == (ON_BUFFER_SEGMENT *)0x0 && this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0) {
      return this->m_current_segment == (ON_BUFFER_SEGMENT *)0x0;
    }
  }
  else if ((((pOVar2 != (ON_BUFFER_SEGMENT *)0x0) &&
            (pOVar2->m_prev_segment == (ON_BUFFER_SEGMENT *)0x0)) &&
           (pOVar3 = this->m_last_segment, pOVar3 != (ON_BUFFER_SEGMENT *)0x0)) &&
          (pOVar3->m_next_segment == (ON_BUFFER_SEGMENT *)0x0)) {
    uVar6 = 0;
    pOVar7 = (ON_BUFFER_SEGMENT *)0x0;
    do {
      pOVar5 = pOVar2;
      if (pOVar7 != pOVar5->m_prev_segment) {
        return false;
      }
      if (pOVar7 == (ON_BUFFER_SEGMENT *)0x0) {
        OVar8 = pOVar5->m_segment_position0;
      }
      else {
        OVar8 = pOVar7->m_segment_position1;
        if (OVar8 != pOVar5->m_segment_position0) {
          return false;
        }
      }
      uVar4 = pOVar5->m_segment_position1;
      if (uVar4 <= OVar8) {
        return false;
      }
      if (uVar6 != OVar8) {
        return false;
      }
      pOVar2 = pOVar5->m_next_segment;
      uVar6 = uVar4;
      pOVar7 = pOVar5;
    } while (pOVar5->m_next_segment != (ON_BUFFER_SEGMENT *)0x0);
    if (((uVar1 <= uVar4 && pOVar3 == pOVar5) && (pOVar3->m_segment_position0 < uVar1)) &&
       (uVar1 <= pOVar3->m_segment_position1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Buffer::IsValid( const ON_TextLog* text_log ) const
{
  // This function is primarily used to discover bugs
  // in the ON_Buffer member function code.

  if ( 0 == m_buffer_size )
  {

    if ( 0 != m_first_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != m_last_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != m_current_segment )
      return ON_Buffer_IsNotValid();

    return true;
  }


  if ( 0 == m_first_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 != m_first_segment->m_prev_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 == m_last_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 != m_last_segment->m_next_segment )
    return ON_Buffer_IsNotValid();

  bool bCurrentSegInList = (0 == m_current_segment);
  ON__UINT64 pos = 0;
  ON__UINT64 u;
  const struct ON_BUFFER_SEGMENT* prev_seg = 0;
  const struct ON_BUFFER_SEGMENT* seg;
  for ( seg = m_first_segment; seg != 0; seg = seg->m_next_segment )
  {
    if ( prev_seg != seg->m_prev_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != prev_seg && prev_seg->m_segment_position1 != seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();
    if ( seg->m_segment_position1 <= seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();
    if ( pos != seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();

    if ( m_current_segment == seg )
      bCurrentSegInList = true;

    // pos checks prevent infinite loop when the linked list has a cycle;
    u = pos + (seg->m_segment_position1 - seg->m_segment_position0);
    if ( pos >= u )
      return ON_Buffer_IsNotValid(); // addition wrapped value
    pos = u;
    prev_seg = seg;
  }

  if ( m_last_segment != prev_seg )
    return ON_Buffer_IsNotValid();

  if ( pos < m_buffer_size )
    return ON_Buffer_IsNotValid();

  if (    m_buffer_size <= m_last_segment->m_segment_position0 
       || m_buffer_size > m_last_segment->m_segment_position1 
     )
    return ON_Buffer_IsNotValid();

  return true;
}